

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::copyAppend
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,QSocks5RevivedDatagram *b,
          QSocks5RevivedDatagram *e)

{
  QSocks5RevivedDatagram *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
    do {
      pDVar2 = (b->data).d.d;
      pQVar1[lVar3].data.d.d = pDVar2;
      pQVar1[lVar3].data.d.ptr = (b->data).d.ptr;
      pQVar1[lVar3].data.d.size = (b->data).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QHostAddress::QHostAddress(&pQVar1[lVar3].address,&b->address);
      pQVar1[lVar3].port = b->port;
      lVar3 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size + 1;
      (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size = lVar3;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }